

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeCompoundRef(TranslateToFuzzReader *this,Type type)

{
  int iVar1;
  long lVar2;
  uintptr_t *puVar3;
  char cVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  HeapType HVar7;
  mapped_type *pmVar8;
  StructNew *pSVar9;
  Const *size;
  Expression *pEVar10;
  uint uVar11;
  char *pcVar12;
  int iVar13;
  Field *field;
  long lVar14;
  uintptr_t *puVar15;
  long lVar16;
  long lVar17;
  Type TVar18;
  long lVar19;
  Expression *local_78;
  uintptr_t uStack_70;
  undefined1 auStack_68 [8];
  Field element;
  HeapType heapType;
  Type local_40;
  Type type_local;
  
  local_40.id = type.id;
  if ((type.id < 7) || ((type.id & 1) != 0)) {
    __assert_fail("type.isRef()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xdf3,"Expression *wasm::TranslateToFuzzReader::makeCompoundRef(Type)");
  }
  HVar7 = Type::getHeapType(&local_40);
  if (HVar7.id < 0x7d) {
    __assert_fail("!heapType.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xdf5,"Expression *wasm::TranslateToFuzzReader::makeCompoundRef(Type)");
  }
  if (((this->wasm->features).features & 0x100) == 0) {
    __assert_fail("wasm.features.hasReferenceTypes()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xdf6,"Expression *wasm::TranslateToFuzzReader::makeCompoundRef(Type)");
  }
  iVar13 = (this->fuzzParams->super_FuzzParams).NESTING_LIMIT;
  iVar1 = this->nesting;
  this->nesting = iVar1 + 1;
  if ((((uint)local_40.id & 3) == 2 && 6 < local_40.id) &&
     ((iVar13 <= iVar1 || (this->random).finishedInput != false ||
      (uVar5 = Random::upTo(&this->random,(iVar13 - iVar1) + 1), uVar5 == 0)))) {
    pSVar9 = (StructNew *)Builder::makeRefNull(&this->builder,HVar7);
    goto LAB_00142105;
  }
  if (((local_40.id & 3) == 0 && 6 < local_40.id) &&
     ((((this->random).finishedInput != false || (iVar13 < this->nesting)) &&
      (this->funcContext != (FunctionCreationContext *)0x0)))) {
    pmVar8 = std::__detail::
             _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->funcContext->typeLocals,&local_40);
    if ((pmVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pmVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      pEVar10 = (Expression *)Builder::makeRefNull(&this->builder,HVar7);
      pSVar9 = (StructNew *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
      (((SpecificExpression<(wasm::Expression::Id)70> *)
       &pSVar9->super_SpecificExpression<(wasm::Expression::Id)65>)->super_Expression)._id = RefAsId
      ;
      (((SpecificExpression<(wasm::Expression::Id)70> *)
       &pSVar9->super_SpecificExpression<(wasm::Expression::Id)65>)->super_Expression).type.id = 0;
      *(undefined4 *)
       &(pSVar9->operands).
        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data = 0;
      (pSVar9->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = (size_t)pEVar10;
      iVar13 = 1;
      wasm::RefAs::finalize();
      goto LAB_0014210e;
    }
    pSVar9 = (StructNew *)makeLocalGet(this,local_40);
    goto LAB_00142105;
  }
  uVar6 = wasm::HeapType::getKind();
  switch(uVar6) {
  case 1:
    pSVar9 = (StructNew *)makeRefFuncConst(this,local_40);
    break;
  case 2:
    type_local.id = wasm::HeapType::getStruct();
    auStack_68 = (undefined1  [8])0x0;
    element.type.id = 0;
    element.packedType = not_packed;
    element.mutable_ = Immutable;
    lVar19 = *(long *)type_local.id;
    lVar2 = *(long *)(type_local.id + 8);
    lVar17 = lVar2 - lVar19;
    if (0 < lVar17 >> 6) {
      lVar16 = (lVar17 >> 6) + 1;
      do {
        cVar4 = wasm::Type::isDefaultable();
        lVar14 = lVar19;
        TVar18 = type_local;
        if (cVar4 == '\0') goto LAB_001421c2;
        cVar4 = wasm::Type::isDefaultable();
        lVar14 = lVar19 + 0x10;
        TVar18 = type_local;
        if (cVar4 == '\0') goto LAB_001421c2;
        cVar4 = wasm::Type::isDefaultable();
        lVar14 = lVar19 + 0x20;
        TVar18 = type_local;
        if (cVar4 == '\0') goto LAB_001421c2;
        cVar4 = wasm::Type::isDefaultable();
        lVar14 = lVar19 + 0x30;
        TVar18 = type_local;
        if (cVar4 == '\0') goto LAB_001421c2;
        lVar19 = lVar19 + 0x40;
        lVar16 = lVar16 + -1;
        lVar17 = lVar17 + -0x40;
      } while (1 < lVar16);
    }
    TVar18.id = type_local.id;
    lVar17 = lVar17 >> 4;
    if (lVar17 == 1) {
LAB_001421ab:
      cVar4 = wasm::Type::isDefaultable();
      lVar14 = lVar19;
      if (cVar4 != '\0') {
        lVar14 = lVar2;
      }
LAB_001421c2:
      if (lVar14 == lVar2) goto LAB_001421c7;
LAB_001421df:
      puVar15 = *(uintptr_t **)TVar18.id;
      puVar3 = *(uintptr_t **)(TVar18.id + 8);
      if (puVar15 != puVar3) {
        do {
          if (this->funcContext == (FunctionCreationContext *)0x0) {
            local_78 = makeTrivial(this,(Type)*puVar15);
          }
          else {
            local_78 = make(this,(Type)*puVar15);
          }
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                     &local_78);
          puVar15 = puVar15 + 2;
        } while (puVar15 != puVar3);
      }
      if (auStack_68 == (undefined1  [8])element.type.id) {
        iVar13 = 1;
      }
      else {
        iVar13 = (int)((long)(element.type.id - (long)auStack_68) >> 3);
        this->nesting = this->nesting + iVar13 + -1;
      }
    }
    else {
      if (lVar17 == 2) {
LAB_0014218b:
        cVar4 = wasm::Type::isDefaultable();
        lVar14 = lVar19;
        if (cVar4 != '\0') {
          lVar19 = lVar19 + 0x10;
          goto LAB_001421ab;
        }
        goto LAB_001421c2;
      }
      if (lVar17 == 3) {
        cVar4 = wasm::Type::isDefaultable();
        lVar14 = lVar19;
        if (cVar4 != '\0') {
          lVar19 = lVar19 + 0x10;
          goto LAB_0014218b;
        }
        goto LAB_001421c2;
      }
LAB_001421c7:
      iVar13 = 1;
      uVar5 = Random::upTo(&this->random,2);
      if (uVar5 == 0) goto LAB_001421df;
    }
    pSVar9 = Builder::
             makeStructNew<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       (&this->builder,HVar7,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_68);
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,element._8_8_ - (long)auStack_68);
    }
    goto LAB_0014210e;
  case 3:
    wasm::HeapType::getArray();
    auStack_68 = (undefined1  [8])local_78;
    element.type.id = uStack_70;
    cVar4 = wasm::Type::isDefaultable();
    if ((cVar4 == '\0') || (uVar5 = Random::upTo(&this->random,2), uVar5 == 0)) {
      if (this->funcContext == (FunctionCreationContext *)0x0) {
        pEVar10 = makeTrivial(this,(Type)auStack_68);
      }
      else {
        pEVar10 = make(this,(Type)auStack_68);
      }
    }
    else {
      pEVar10 = (Expression *)0x0;
    }
    uVar5 = Random::upTo(&this->random,(this->fuzzParams->super_FuzzParams).MAX_ARRAY_SIZE);
    size = Builder::makeConst<int>(&this->builder,uVar5);
    HVar7 = Type::getHeapType(&local_40);
    pSVar9 = (StructNew *)Builder::makeArrayNew(&this->builder,HVar7,(Expression *)size,pEVar10);
    break;
  case 4:
    uVar11 = 0xe4e;
    pcVar12 = "TODO: cont";
    goto LAB_00142301;
  default:
    uVar11 = 0xe52;
    pcVar12 = "unexpected kind";
LAB_00142301:
    wasm::handle_unreachable
              (pcVar12,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,uVar11);
  }
LAB_00142105:
  iVar13 = 1;
LAB_0014210e:
  this->nesting = this->nesting - iVar13;
  return (Expression *)pSVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeCompoundRef(Type type) {
  assert(type.isRef());
  auto heapType = type.getHeapType();
  assert(!heapType.isBasic());
  assert(wasm.features.hasReferenceTypes());

  // Prefer not to emit a null, in general, as we can trap from them. If it is
  // nullable, give a small chance to do so; if we hit the nesting limit then we
  // really have no choice and must emit a null (or else we could infinitely
  // recurse). For the nesting limit, use a bound that is higher than the normal
  // one, so that the normal mechanisms should prevent us from getting here;
  // this limit is really a last resort we want to never reach. Also, increase
  // the chance to emit a null as |nesting| rises, to avoid deep recursive
  // structures.
  //
  // Note that we might have cycles of types where some are non-nullable. We
  // will only stop here when we exceed the nesting and reach a nullable one.
  // (This assumes there is a nullable one, that is, that the types are
  // inhabitable.)
  const auto LIMIT = fuzzParams->NESTING_LIMIT + 1;
  AutoNester nester(*this);
  if (type.isNullable() &&
      (random.finished() || nesting >= LIMIT || oneIn(LIMIT - nesting + 1))) {
    return builder.makeRefNull(heapType);
  }

  // If the type is non-nullable, but we've run out of input, then we need to do
  // something here to avoid infinite recursion. In the worse case we'll emit a
  // cast to non-null of a null, which validates, but it will trap at runtime
  // which is not ideal.
  if (type.isNonNullable() && (random.finished() || nesting >= LIMIT)) {
    // If we have a function context then we can at least emit a local.get,
    // sometimes, which is less bad. Note that we need to check typeLocals
    // manually here to avoid infinite recursion (as makeLocalGet will fall back
    // to us, if there is no local).
    // TODO: we could also look for locals containing subtypes
    if (funcContext) {
      if (!funcContext->typeLocals[type].empty()) {
        return makeLocalGet(type);
      }
      // No local, but we are in a function context so RefAsNonNull is valid.
      return builder.makeRefAs(RefAsNonNull, builder.makeRefNull(heapType));
    }
    // No function context, so we are in quite the pickle. Continue onwards, as
    // we may succeed to emit something more complex (like a struct.new).
  }

  // When we make children, they must be trivial if we are not in a function
  // context.
  auto makeChild = [&](Type type) {
    return funcContext ? make(type) : makeTrivial(type);
  };

  switch (heapType.getKind()) {
    case HeapTypeKind::Func:
      return makeRefFuncConst(type);
    case HeapTypeKind::Struct: {
      auto& fields = heapType.getStruct().fields;
      std::vector<Expression*> values;
      // If there is a nondefaultable field, we must provide the value and not
      // depend on defaults. Also do that randomly half the time.
      if (std::any_of(
            fields.begin(),
            fields.end(),
            [&](const Field& field) { return !field.type.isDefaultable(); }) ||
          oneIn(2)) {
        for (auto& field : fields) {
          values.push_back(makeChild(field.type));
        }
        // Add more nesting manually, as we can easily get exponential blowup
        // here. This nesting makes it much less likely for a recursive data
        // structure to end up as a massive tree of struct.news, since the
        // nesting limitation code at the top of this function will kick in.
        if (!values.empty()) {
          // Subtract 1 since if there is a single value there cannot be
          // exponential blowup.
          nester.add(values.size() - 1);
        }
      }
      return builder.makeStructNew(heapType, values);
    }
    case HeapTypeKind::Array: {
      auto element = heapType.getArray().element;
      Expression* init = nullptr;
      if (!element.type.isDefaultable() || oneIn(2)) {
        init = makeChild(element.type);
      }
      auto* count =
        builder.makeConst(int32_t(upTo(fuzzParams->MAX_ARRAY_SIZE)));
      return builder.makeArrayNew(type.getHeapType(), count, init);
    }
    case HeapTypeKind::Cont:
      WASM_UNREACHABLE("TODO: cont");
    case HeapTypeKind::Basic:
      break;
  }
  WASM_UNREACHABLE("unexpected kind");
}